

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O3

void testing::Mock::ClearDefaultActionsLocked(void *mock_obj)

{
  long lVar1;
  mapped_type *pmVar2;
  _Rb_tree_node_base *p_Var3;
  long lVar4;
  key_type *in_RSI;
  ulong in_RDI;
  bool bVar5;
  
  internal::MutexBase::AssertHeld((MutexBase *)internal::g_gmock_mutex);
  if ((anonymous_namespace)::g_mock_object_registry._16_8_ != 0) {
    lVar1 = 0x6fac78;
    lVar4 = (anonymous_namespace)::g_mock_object_registry._16_8_;
    do {
      bVar5 = *(ulong *)(lVar4 + 0x20) < in_RDI;
      if (!bVar5) {
        lVar1 = lVar4;
      }
      lVar4 = *(long *)(lVar4 + 0x10 + (ulong)bVar5 * 8);
    } while (lVar4 != 0);
    if ((lVar1 != 0x6fac78) && (*(ulong *)(lVar1 + 0x20) <= in_RDI)) {
      pmVar2 = std::
               map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
               ::operator[]((map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
                             *)&stack0xffffffffffffffe8,in_RSI);
      for (p_Var3 = (pmVar2->function_mockers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var3 !=
          &(pmVar2->function_mockers)._M_t._M_impl.super__Rb_tree_header;
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        (**(code **)(**(long **)(p_Var3 + 1) + 0x10))();
      }
    }
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(internal::g_gmock_mutex) {
  internal::g_gmock_mutex.AssertHeld();

  if (g_mock_object_registry.states().count(mock_obj) == 0) {
    // No ON_CALL() was set on the given mock object.
    return;
  }

  // Clears the default actions for each mock method in the given mock
  // object.
  FunctionMockers& mockers =
      g_mock_object_registry.states()[mock_obj].function_mockers;
  for (FunctionMockers::const_iterator it = mockers.begin();
       it != mockers.end(); ++it) {
    (*it)->ClearDefaultActionsLocked();
  }

  // We don't clear the content of mockers, as they may still be
  // needed by VerifyAndClearExpectationsLocked().
}